

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioSop.c
# Opt level: O0

Vec_Int_t * Mio_SopCoverOr(Vec_Int_t *p,Vec_Int_t *q)

{
  int iVar1;
  int iVar2;
  uint c;
  Vec_Int_t *p_00;
  undefined4 local_28;
  int i;
  uint Entry;
  Vec_Int_t *r;
  Vec_Int_t *q_local;
  Vec_Int_t *p_local;
  
  iVar1 = Vec_IntSize(p);
  iVar2 = Vec_IntSize(q);
  p_00 = Vec_IntAlloc(iVar1 + iVar2);
  for (local_28 = 0; iVar1 = Vec_IntSize(p), local_28 < iVar1; local_28 = local_28 + 1) {
    iVar1 = Vec_IntEntry(p,local_28);
    Vec_IntPush(p_00,iVar1);
  }
  for (local_28 = 0; iVar1 = Vec_IntSize(q), local_28 < iVar1; local_28 = local_28 + 1) {
    c = Vec_IntEntry(q,local_28);
    Mio_SopPushSCC(p_00,c);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Mio_SopCoverOr( Vec_Int_t * p, Vec_Int_t * q )
{
    Vec_Int_t * r;
    unsigned Entry;
    int i;
    r = Vec_IntAlloc( Vec_IntSize(p) + Vec_IntSize(q) );
    Vec_IntForEachEntry( p, Entry, i )
        Vec_IntPush( r, Entry );
    Vec_IntForEachEntry( q, Entry, i )
        Mio_SopPushSCC( r, Entry );
    return r;
}